

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

vector<GenTxid,_std::allocator<GenTxid>_> * __thiscall
TxRequestTracker::Impl::GetRequestable
          (vector<GenTxid,_std::allocator<GenTxid>_> *__return_storage_ptr__,Impl *this,NodeId peer,
          microseconds now,
          vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *expired)

{
  long lVar1;
  iterator iVar2;
  pointer ppAVar3;
  pointer *pppAVar4;
  undefined8 uVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t __n;
  size_t extraout_RDX_02;
  undefined1 *puVar6;
  pointer __p;
  pointer *pppAVar7;
  __normal_iterator<const_(anonymous_namespace)::Announcement_**,_std::vector<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>_>
  __i;
  pointer *this_00;
  size_t __n_00;
  ulong __n_01;
  long in_FS_OFFSET;
  iterator it_peer;
  vector<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
  local_78;
  undefined1 local_60 [40];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SetTimePoint(this,now,expired);
  local_78.
  super__Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60[0] = true;
  local_60[1] = 0xcd;
  local_60[2] = 't';
  local_60[3] = '\0';
  local_60[4] = '\0';
  local_60[5] = '\0';
  local_60[6] = '\0';
  local_60[7] = '\0';
  local_60[8] = true;
  local_60[0x10] = (uchar)peer;
  local_60._17_7_ = (undefined7)((ulong)peer >> 8);
  it_peer = boost::multi_index::detail::
            ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
            ::lower_bound<std::tuple<long,bool,uint256_const&>>
                      ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                        *)&(this->m_index).super_type,(tuple<long,_bool,_const_uint256_&> *)local_60
                      );
  pppAVar7 = (pointer *)0x0;
  __n = extraout_RDX;
  this_00 = (pointer *)0x0;
  while (((iVar2.node = it_peer.node,
          it_peer.node !=
          (this->m_index).
          super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
          .member &&
          (*(long *)((long)&((it_peer.node)->
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                            ).
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                            .
                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                            .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                    + 0x28) == peer)) &&
         ((uint)((ulong)*(undefined8 *)
                         ((long)&((it_peer.node)->
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                 ).
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                 .
                                 super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                 .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                 data_ + 0x30) >> 0x3d) == 2))) {
    if ((pointer)pppAVar7 ==
        local_78.
        super__Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __n_00 = (long)pppAVar7 - (long)this_00;
      if (__n_00 == 0x7ffffffffffffff8) {
        local_78.
        super__Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar5 = std::__throw_length_error("vector::_M_realloc_insert");
          std::_Vector_base<GenTxid,_std::allocator<GenTxid>_>::~_Vector_base
                    (&__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)
          ;
          std::
          vector<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
          ::~vector(&local_78);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar5);
          }
        }
        goto LAB_0035936c;
      }
      __p = (pointer)((long)__n_00 >> 3);
      ppAVar3 = (pointer)&DAT_00000001;
      if (pppAVar7 != this_00) {
        ppAVar3 = __p;
      }
      puVar6 = (undefined1 *)((long)ppAVar3 + (long)__p);
      if ((undefined1 *)0xffffffffffffffe < puVar6) {
        puVar6 = (undefined1 *)0xfffffffffffffff;
      }
      if (CARRY8((ulong)ppAVar3,(ulong)__p)) {
        puVar6 = (undefined1 *)0xfffffffffffffff;
      }
      if (puVar6 == (undefined1 *)0x0) {
        pppAVar4 = (pointer *)0x0;
      }
      else {
        pppAVar4 = (pointer *)operator_new((long)puVar6 * 8);
        __n = extraout_RDX_00;
      }
      pppAVar4[(long)__p] = (pointer)iVar2.node;
      if (0 < (long)__n_00) {
        memmove(pppAVar4,this_00,__n_00);
        __n = extraout_RDX_01;
      }
      pppAVar7 = (pointer *)(__n_00 + (long)pppAVar4);
      std::
      _Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
      ::_M_deallocate((_Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
                       *)this_00,__p,__n);
      local_78.
      super__Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pppAVar4 + (long)puVar6);
    }
    else {
      *pppAVar7 = (pointer)it_peer.node;
      pppAVar4 = this_00;
    }
    pppAVar7 = &(((_Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
                   *)pppAVar7)->_M_impl).super__Vector_impl_data._M_finish;
    local_78.
    super__Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)pppAVar7;
    boost::multi_index::detail::
    ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
    ::increment(&it_peer.node);
    __n = extraout_RDX_02;
    this_00 = pppAVar4;
  }
  __n_01 = (long)pppAVar7 - (long)this_00 >> 3;
  local_78.
  super__Vector_base<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  if (pppAVar7 != this_00) {
    lVar1 = 0x3f;
    if (__n_01 != 0) {
      for (; __n_01 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Announcement_const**,std::vector<(anonymous_namespace)::Announcement_const*,std::allocator<(anonymous_namespace)::Announcement_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TxRequestTracker::Impl::GetRequestable(long,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>*)::_lambda((anonymous_namespace)::Announcement_const*,(anonymous_namespace)::Announcement_const*)_1_>>
              (this_00,pppAVar7,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pppAVar7 - (long)this_00 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Announcement_const**,std::vector<(anonymous_namespace)::Announcement_const*,std::allocator<(anonymous_namespace)::Announcement_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxRequestTracker::Impl::GetRequestable(long,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>*)::_lambda((anonymous_namespace)::Announcement_const*,(anonymous_namespace)::Announcement_const*)_1_>>
                (this_00,pppAVar7);
    }
    else {
      pppAVar4 = this_00 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Announcement_const**,std::vector<(anonymous_namespace)::Announcement_const*,std::allocator<(anonymous_namespace)::Announcement_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxRequestTracker::Impl::GetRequestable(long,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>*)::_lambda((anonymous_namespace)::Announcement_const*,(anonymous_namespace)::Announcement_const*)_1_>>
                (this_00,pppAVar4);
      for (; pppAVar4 != pppAVar7; pppAVar4 = pppAVar4 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Announcement_const**,std::vector<(anonymous_namespace)::Announcement_const*,std::allocator<(anonymous_namespace)::Announcement_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<TxRequestTracker::Impl::GetRequestable(long,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>*)::_lambda((anonymous_namespace)::Announcement_const*,(anonymous_namespace)::Announcement_const*)_1_>>
                  (pppAVar4);
      }
    }
  }
  (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<GenTxid,_std::allocator<GenTxid>_>::reserve(__return_storage_ptr__,__n_01);
  for (; this_00 != pppAVar7; this_00 = this_00 + 1) {
    ppAVar3 = *this_00;
    local_60._25_8_ = ppAVar3[3];
    local_60._17_7_ = SUB87(ppAVar3[2],0);
    local_60[0x18] = (uchar)((ulong)ppAVar3[2] >> 0x38);
    local_60._1_7_ = SUB87(*ppAVar3,0);
    local_60[8] = SUB81((ulong)*ppAVar3 >> 0x38,0);
    local_60._9_7_ = SUB87(ppAVar3[1],0);
    local_60[0x10] = (uchar)((ulong)ppAVar3[1] >> 0x38);
    local_60[0] = (bool)((byte)((ulong)ppAVar3[6] >> 0x3c) & 1);
    std::vector<GenTxid,_std::allocator<GenTxid>_>::emplace_back<GenTxid>
              (__return_storage_ptr__,(GenTxid *)local_60);
  }
  std::
  vector<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>
  ::~vector(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0035936c:
  __stack_chk_fail();
}

Assistant:

std::vector<GenTxid> GetRequestable(NodeId peer, std::chrono::microseconds now,
        std::vector<std::pair<NodeId, GenTxid>>* expired)
    {
        // Move time.
        SetTimePoint(now, expired);

        // Find all CANDIDATE_BEST announcements for this peer.
        std::vector<const Announcement*> selected;
        auto it_peer = m_index.get<ByPeer>().lower_bound(ByPeerView{peer, true, uint256::ZERO});
        while (it_peer != m_index.get<ByPeer>().end() && it_peer->m_peer == peer &&
            it_peer->GetState() == State::CANDIDATE_BEST) {
            selected.emplace_back(&*it_peer);
            ++it_peer;
        }

        // Sort by sequence number.
        std::sort(selected.begin(), selected.end(), [](const Announcement* a, const Announcement* b) {
            return a->m_sequence < b->m_sequence;
        });

        // Convert to GenTxid and return.
        std::vector<GenTxid> ret;
        ret.reserve(selected.size());
        std::transform(selected.begin(), selected.end(), std::back_inserter(ret), [](const Announcement* ann) {
            return ToGenTxid(*ann);
        });
        return ret;
    }